

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *local_80;
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  char *local_30;
  char *local_20;
  
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "------------- Running tests for Dice class -------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"Dice");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"constructor");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Dice();
  if (bVar1) {
    local_20 = "\x1b[32mPass";
  }
  else {
    local_20 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"Dice");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"roll");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Dice_roll();
  if (bVar1) {
    local_30 = "\x1b[32mPass";
  }
  else {
    local_30 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[34m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "---------- Running tests for DiceRoller class ----------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"constructor");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller();
  if (bVar1) {
    local_40 = "\x1b[32mPass";
  }
  else {
    local_40 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"roll");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_roll();
  if (bVar1) {
    local_50 = "\x1b[32mPass";
  }
  else {
    local_50 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_50);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getHistory");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_getHistory();
  if (bVar1) {
    local_60 = "\x1b[32mPass";
  }
  else {
    local_60 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_60);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getDiceRoller");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_getDiceRolled();
  if (bVar1) {
    local_70 = "\x1b[32mPass";
  }
  else {
    local_70 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_70);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getPercentages");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_getPercentages();
  if (bVar1) {
    local_80 = "\x1b[32mPass";
  }
  else {
    local_80 = "\x1b[31mFail";
  }
  poVar2 = std::operator<<(poVar2,local_80);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------- Running tests for Dice class -------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    std::cout << assert("Dice", "constructor", test_Dice());
    std::cout << assert("Dice", "roll", test_Dice_roll());

    std::cout << "\033[34m" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "---------- Running tests for DiceRoller class ----------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    std::cout << assert("DiceRoller", "constructor", test_DiceRoller());
    std::cout << assert("DiceRoller", "roll", test_DiceRoller_roll());
    std::cout << assert("DiceRoller", "getHistory", test_DiceRoller_getHistory());
    std::cout << assert("DiceRoller", "getDiceRoller", test_DiceRoller_getDiceRolled());
    std::cout << assert("DiceRoller", "getPercentages", test_DiceRoller_getPercentages());

    return 0;
}